

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

int yang_read_require_instance(yang_type *stype,int req)

{
  if ((stype->base == LY_TYPE_DER) || (stype->base == LY_TYPE_LEAFREF)) {
    if ((stype->type->info).lref.req == '\0') {
      (stype->type->info).lref.req = (int8_t)req;
      stype->base = LY_TYPE_LEAFREF;
      return 0;
    }
    ly_vlog(LYE_TOOMANY,LY_VLOG_NONE,(void *)0x0,"require-instance","type");
  }
  else {
    ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"require-instance");
  }
  return 1;
}

Assistant:

int
yang_read_require_instance(struct yang_type *stype, int req)
{
    if (stype->base && (stype->base != LY_TYPE_LEAFREF)) {
        LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "require-instance");
        return EXIT_FAILURE;
    }
    if (stype->type->info.lref.req) {
        LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, "require-instance", "type");
        return EXIT_FAILURE;
    }
    stype->type->info.lref.req = req;
    stype->base = LY_TYPE_LEAFREF;
    return EXIT_SUCCESS;
}